

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

bool __thiscall google::protobuf::internal::ExtensionSet::Has(ExtensionSet *this,int number)

{
  Extension *pEVar1;
  bool bVar2;
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    bVar2 = false;
  }
  else {
    if (pEVar1->is_repeated == true) {
      Has();
    }
    bVar2 = (pEVar1->field_0xa & 2) == 0;
  }
  return bVar2;
}

Assistant:

bool ExtensionSet::Has(int number) const {
  const Extension* ext = FindOrNull(number);
  if (ext == nullptr) return false;
  ABSL_DCHECK(!ext->is_repeated);
  return !ext->is_cleared;
}